

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffpclu(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelempar,
          int *status)

{
  int iVar1;
  size_t sVar2;
  double local_218;
  size_t local_210;
  size_t buffsize;
  long jbuff [2];
  char snull [20];
  char local_198 [8];
  char message [81];
  char *cstring;
  char tform [20];
  undefined1 local_11a;
  undefined1 local_119;
  uchar lognul;
  uchar i1null;
  double zero;
  double scale;
  LONGLONG ntodo;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  LONGLONG i8null;
  LONGLONG tnull;
  LONGLONG nelem;
  LONGLONG largeelem;
  LONGLONG ii;
  long incre;
  long twidth;
  short local_7e;
  int i4null;
  int iStack_78;
  short i2null;
  int leng;
  int writemode;
  int hdutype;
  int maxelem;
  int tcode;
  int *status_local;
  LONGLONG nelempar_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  iStack_78 = 2;
  local_11a = 0;
  stack0xfffffffffffffec0 = (char *)0x0;
  buffsize = 0xffffffffffffffff;
  jbuff[0] = -1;
  if (*status < 1) {
    tnull = nelempar;
    nelem = firstelem;
    _maxelem = status;
    status_local = (int *)nelempar;
    nelempar_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    ffgtcl(fptr,colnum,&hdutype,(long *)0x0,(long *)0x0,status);
    if (hdutype < 0) {
      iStack_78 = 0;
    }
    iVar1 = hdutype;
    if (hdutype < 1) {
      iVar1 = -hdutype;
    }
    if (0x52 < iVar1) {
      nelem = (nelem + -1) * 2 + 1;
      tnull = tnull << 1;
    }
    iVar1 = ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem,tnull,iStack_78,&zero,
                     (double *)&stack0xfffffffffffffee8,(char *)&cstring,&incre,&hdutype,&writemode,
                     &elemnum,&wrtptr,&ii,&startpos,&rownum,&leng,&i8null,(char *)(jbuff + 1),
                     _maxelem);
    if (iVar1 < 1) {
      if (hdutype == 0x10) {
        if ((char)jbuff[1] == '\x01') {
          ffpmsg("Null value string for ASCII table column is not defined (FTPCLU).");
          *_maxelem = 0x13a;
          return 0x13a;
        }
        if (incre < 0x14) {
          local_210 = 0x14;
        }
        else {
          local_210 = incre;
        }
        register0x00000000 = (char *)malloc(local_210);
        if (register0x00000000 == (char *)0x0) {
          *_maxelem = 0x71;
          return 0x71;
        }
        memset(register0x00000000,0x20,local_210);
        sVar2 = strlen((char *)(jbuff + 1));
        i4null = (int)sVar2;
        if (leng == 2) {
          i4null = i4null + 1;
        }
        strncpy(stack0xfffffffffffffec0,(char *)(jbuff + 1),(long)i4null);
      }
      else if ((((hdutype == 0xb) || (hdutype == 0x15)) || (hdutype == 0x29)) || (hdutype == 0x51))
      {
        if (i8null == 0x4995cdd1) {
          ffpmsg("Null value for integer table column is not defined (FTPCLU).");
          *_maxelem = 0x13a;
          return 0x13a;
        }
        if (hdutype == 0xb) {
          local_119 = (undefined1)i8null;
        }
        else if (hdutype == 0x15) {
          local_7e = (short)i8null;
          ffswap2(&local_7e,1);
        }
        else if (hdutype == 0x29) {
          twidth._4_4_ = (undefined4)i8null;
          ffswap4((int *)((long)&twidth + 4),1);
        }
        else {
          repeat = i8null;
          ffswap8((double *)&repeat,1);
        }
      }
      next = tnull;
      ntodo = 0;
      remain = 0;
      while (next != 0) {
        if (next < startpos - wrtptr) {
          local_218 = (double)next;
        }
        else {
          local_218 = (double)(startpos - wrtptr);
        }
        scale = local_218;
        rowlen = elemnum + remain * rownum + wrtptr * ii;
        ffmbyt(pfStack_40,rowlen,1,_maxelem);
        switch(hdutype) {
        case 0xb:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,1,&local_119,_maxelem);
          }
          break;
        default:
          snprintf(local_198,0x51,"Cannot write null value to column %d which has format %s",
                   (ulong)firstrow_local._4_4_,&cstring);
          ffpmsg(local_198);
          return *_maxelem;
        case 0xe:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,1,&local_11a,_maxelem);
          }
          break;
        case 0x10:
          ffpbyt(pfStack_40,incre,stack0xfffffffffffffec0,_maxelem);
          break;
        case 0x15:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,2,&local_7e,_maxelem);
          }
          break;
        case 0x29:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,4,(void *)((long)&twidth + 4),_maxelem);
          }
          break;
        case 0x2a:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,4,&buffsize,_maxelem);
          }
          break;
        case 0x51:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,8,&repeat,_maxelem);
          }
          break;
        case 0x52:
          for (largeelem = 0; largeelem < (long)scale; largeelem = largeelem + 1) {
            ffpbyt(pfStack_40,8,&buffsize,_maxelem);
          }
        }
        if (0 < *_maxelem) {
          snprintf(local_198,0x51,"Error writing %.0f thru %.0f of null values (ffpclu).",
                   (double)(ntodo + 1),(double)(ntodo + (long)scale));
          ffpmsg(local_198);
          if (stack0xfffffffffffffec0 != (char *)0x0) {
            free(stack0xfffffffffffffec0);
          }
          return *_maxelem;
        }
        next = next - (long)scale;
        if (next != 0) {
          ntodo = (long)scale + ntodo;
          wrtptr = (long)scale + wrtptr;
          if (wrtptr == startpos) {
            wrtptr = 0;
            remain = remain + 1;
          }
        }
      }
      if (stack0xfffffffffffffec0 != (char *)0x0) {
        scale = (double)next;
        free(stack0xfffffffffffffec0);
      }
      fptr_local._4_4_ = *_maxelem;
    }
    else {
      fptr_local._4_4_ = *_maxelem;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpclu( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelempar,     /* I - number of values to write               */
            int  *status)    /* IO - error status                           */
/*
  Set elements of a table column to the appropriate null value for the column
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.
  
  This routine support COMPLEX and DOUBLE COMPLEX binary table columns, and
  sets both the real and imaginary components of the element to a NaN.
*/
{
    int tcode, maxelem, hdutype, writemode = 2, leng;
    short i2null;
    INT32BIT i4null;
    long twidth, incre;
    LONGLONG ii;
    LONGLONG largeelem, nelem, tnull, i8null;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, ntodo;
    double scale, zero;
    unsigned char i1null, lognul = 0;
    char tform[20], *cstring = 0;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    long   jbuff[2] = { -1, -1};  /* all bits set is equivalent to a NaN */
    size_t buffsize;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    nelem = nelempar;
    
    largeelem = firstelem;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* note that writemode = 2 by default (not 1), so that the returned */
    /* repeat and incre values will be the actual values for this column. */

    /* If writing nulls to a variable length column then dummy data values  */
    /* must have already been written to the heap. */
    /* We just have to overwrite the previous values with null values. */
    /* Set writemode = 0 in this case, to test that values have been written */

    fits_get_coltype(fptr, colnum, &tcode, NULL, NULL, status);
    if (tcode < 0)
         writemode = 0;  /* this is a variable length column */

    if (abs(tcode) >= TCOMPLEX)
    { /* treat complex columns as pairs of numbers */
      largeelem = (largeelem - 1) * 2 + 1;
      nelem *= 2;
    }

    if (ffgcprll( fptr, colnum, firstrow, largeelem, nelem, writemode, &scale,
       &zero, tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)
    {
      if (snull[0] == ASCII_NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value string for ASCII table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      /* allocate buffer to hold the null string.  Must write the entire */
      /* width of the column (twidth bytes) to avoid possible problems */
      /* with uninitialized FITS blocks, in case the field spans blocks */

      buffsize = maxvalue(20, twidth);
      cstring = (char *) malloc(buffsize);
      if (!cstring)
         return(*status = MEMORY_ALLOCATION);

      memset(cstring, ' ', buffsize);  /* initialize  with blanks */

      leng = strlen(snull);
      if (hdutype == BINARY_TBL)
         leng++;        /* copy the terminator too in binary tables */

      strncpy(cstring, snull, leng);  /* copy null string to temp buffer */
    }
    else if ( tcode == TBYTE  ||
              tcode == TSHORT ||
              tcode == TLONG  ||
              tcode == TLONGLONG) 
    {
      if (tnull == NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value for integer table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      if (tcode == TBYTE)
         i1null = (unsigned char) tnull;
      else if (tcode == TSHORT)
      {
         i2null = (short) tnull;
#if BYTESWAPPED
         ffswap2(&i2null, 1); /* reverse order of bytes */
#endif
      }
      else if (tcode == TLONG)
      {
         i4null = (INT32BIT) tnull;
#if BYTESWAPPED
         ffswap4(&i4null, 1); /* reverse order of bytes */
#endif
      }
      else
      {
         i8null = tnull;
#if BYTESWAPPED
         ffswap8((double *)(&i8null), 1);  /* reverse order of bytes */
#endif
      }
    }

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */
    ntodo = remain;           /* number of elements to write at one time */

    while (ntodo)
    {
        /* limit the number of pixels to process at one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = minvalue(ntodo, (repeat - elemnum));
        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1,  &i1null, status);
                break;

            case (TSHORT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 2, &i2null, status);
                break;

            case (TLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, &i4null, status);
                break;

            case (TLONGLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, &i8null, status);
                break;

            case (TFLOAT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, jbuff, status);
                break;

            case (TDOUBLE):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, jbuff, status);
                break;

            case (TLOGICAL):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1, &lognul, status);
                break;

            case (TSTRING):  /* an ASCII table column */
                /* repeat always = 1, so ntodo is also guaranteed to = 1 */
                ffpbyt(fptr, twidth, cstring, status);
                break;

            default:  /*  error trap  */
                snprintf(message,FLEN_ERRMSG, 
                   "Cannot write null value to column %d which has format %s",
                     colnum,tform);
                ffpmsg(message);
                return(*status);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
           snprintf(message,FLEN_ERRMSG,
             "Error writing %.0f thru %.0f of null values (ffpclu).",
              (double) (next+1), (double) (next+ntodo));
           ffpmsg(message);

           if (cstring)
              free(cstring);

           return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
        ntodo = remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    if (cstring)
       free(cstring);

    return(*status);
}